

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatVehicle.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatVehicle::Encode
          (GED_EnhancedGroundCombatVehicle *this,KDataStream *stream)

{
  GED_BasicGroundCombatVehicle::Encode(&this->super_GED_BasicGroundCombatVehicle,stream);
  KDataStream::Write(stream,this->m_ui8FuelStatus);
  KDataStream::Write(stream,this->m_ui8GrndMaintStatus);
  KDataStream::Write(stream,this->m_ui8PriAmmun);
  KDataStream::Write(stream,this->m_ui8SecAmmun);
  return;
}

Assistant:

void GED_EnhancedGroundCombatVehicle::Encode( KDataStream & stream ) const
{
    GED_BasicGroundCombatVehicle::Encode( stream );

    stream << m_ui8FuelStatus
           << m_ui8GrndMaintStatus
           << m_ui8PriAmmun
           << m_ui8SecAmmun;
}